

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundoview.cpp
# Opt level: O0

QModelIndex * __thiscall QUndoModel::selectedIndex(QUndoModel *this)

{
  QAbstractItemModel *in_RSI;
  QModelIndex *in_RDI;
  QModelIndex *pQVar1;
  
  if (*(long *)(in_RSI + 0x10) == 0) {
    QModelIndex::QModelIndex((QModelIndex *)0xa98262);
    pQVar1 = in_RDI;
  }
  else {
    pQVar1 = in_RDI;
    QUndoStack::index();
    QAbstractItemModel::createIndex(in_RSI,(int)((ulong)pQVar1 >> 0x20),(int)pQVar1,in_RDI);
  }
  return pQVar1;
}

Assistant:

QModelIndex QUndoModel::selectedIndex() const
{
    return m_stack == nullptr ? QModelIndex() : createIndex(m_stack->index(), 0);
}